

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O1

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_4
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  double dVar1;
  ulong uVar2;
  pointer puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  size_type sVar11;
  _Base_ptr p_Var12;
  Array_Data_Symbol *pAVar13;
  int iVar14;
  reference puVar15;
  uint uVar16;
  uint uVar17;
  referred_type *prVar18;
  int i;
  size_type sVar19;
  matrix_closure_type mVar20;
  uint32_t r;
  int iVar21;
  matrix_closure_type mVar22;
  matrix_closure_type mVar23;
  R10_Decoder *pRVar24;
  R10_Decoder *this_00;
  referred_type *prVar25;
  referred_type *prVar26;
  pointer pVVar27;
  referred_type *prVar28;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  for_xor;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  group_col;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  U_upper;
  referred_type *local_2b8;
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2a8;
  referred_type *local_278;
  matrix_type *local_270;
  _Rb_tree_node_base local_268;
  undefined1 local_248 [24];
  referred_type *local_230;
  referred_type *local_228;
  referred_type *local_220;
  referred_type *local_218;
  pointer local_210;
  referred_type *local_208;
  referred_type *local_200;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_1f8;
  referred_type *local_1f0;
  referred_type *local_1e8;
  pointer local_1e0;
  referred_type *local_1d8;
  long local_1d0;
  referred_type *local_1c8;
  Utility *local_1c0;
  Array_Data_Symbol *local_1b8;
  basic_range<unsigned_long,_long> local_1b0;
  pointer pVStack_1a0;
  referred_type *local_198;
  referred_type *local_190;
  matrix_type local_188;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  _Base_ptr local_118;
  referred_type **local_110;
  pointer puStack_108;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  basic_range<unsigned_long,_long> local_e8;
  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  local_d8 [8];
  ulong local_d0;
  pointer local_c8;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  local_90 [8];
  pointer local_88;
  pointer local_80;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_1f8 = A;
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  dVar1 = ceil((double)this->A_u * 0.125);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)local_248,0,(ulong)this->A_i);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)&local_268,(ulong)this->A_i,(ulong)D->L);
  boost::numeric::ublas::
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::matrix_range(&local_2a8,local_1f8,(range_type *)local_248,(range_type *)&local_268);
  boost::numeric::ublas::
  matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  ::
  matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
            ((matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_188,
             (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&local_2a8);
  local_248._8_8_ = (Inter_Symbol_Generator *)0x8;
  local_248._16_8_ = operator_new(8);
  uVar16 = (int)(long)dVar1 - 1;
  local_1e0 = (pointer)(ulong)uVar16;
  local_268._M_right = (_Base_ptr)this;
  local_1b8 = D;
  if (uVar16 == 0) {
    local_2b8 = (referred_type *)0x0;
    mVar20.e_ = (matrix_type *)0x0;
  }
  else {
    local_278 = &(this->precomput_param).U_p;
    local_1c0 = &this->util;
    local_1d8 = (referred_type *)(ulong)uVar16;
    local_200 = (referred_type *)0x0;
    mVar20.e_ = (matrix_type *)0x0;
    local_2b8 = (referred_type *)0x0;
    uVar16 = 0;
    do {
      local_1e8 = (referred_type *)(ulong)uVar16;
      if ((referred_type *)local_188.size1_ != (referred_type *)0x0) {
        local_1d0 = (long)local_1e8 << 5;
        uVar16 = (int)local_200 * 0xff;
        local_1c8 = (referred_type *)(ulong)uVar16;
        local_208 = (referred_type *)((long)local_200 * 8);
        local_210 = (pointer)((long)local_200 * 8 + 8);
        local_218 = (referred_type *)(ulong)(uVar16 + 0xff);
        local_220 = (referred_type *)0x0;
        do {
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_208,
                     (size_type)local_210);
          local_2a8.data_.e_ = &local_188;
          local_2a8.r1_.start_ = (size_type)local_220;
          local_2a8.r1_.size_ = local_268._0_8_;
          local_2a8.r2_.start_ = (size_type)local_268._M_parent;
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_248,
                      (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)&local_2a8);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          unbounded_array(&local_48,
                          (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                          local_248);
          uVar16 = local_248._8_4_ - 1;
          sVar19 = 0;
          iVar21 = 0;
          do {
            puVar15 = boost::numeric::ublas::
                      unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_48,sVar19);
            iVar21 = iVar21 + (uint)(*puVar15 == '\x01');
            sVar19 = sVar19 + 1;
          } while ((uint)sVar19 <= uVar16);
          if (local_48.size_ != 0) {
            operator_delete(local_48.data_,local_48.size_);
          }
          if (iVar21 != 0) {
            pRVar24 = (R10_Decoder *)local_248;
            boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
            unbounded_array(&local_60,
                            (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                            pRVar24);
            find_nonZeros_pos_In_Row
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar24,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_60,0,local_248._8_4_ - 1);
            sVar11 = local_2a8.r1_.size_;
            mVar23.e_ = local_2a8.data_.e_;
            local_1f0 = (referred_type *)local_2a8.r1_.start_;
            local_2a8.data_.e_ = (matrix_type *)0x0;
            local_2a8.r1_.start_ = 0;
            local_2a8.r1_.size_ = 0;
            if (mVar20.e_ != (matrix_type *)0x0) {
              operator_delete(mVar20.e_,(long)local_2b8 - (long)mVar20.e_);
            }
            if (local_2a8.data_.e_ != (matrix_type *)0x0) {
              operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
            }
            if (local_60.size_ != 0) {
              operator_delete(local_60.data_,local_60.size_);
            }
            prVar25 = (referred_type *)0x0;
            mVar22.e_ = (referred_type *)0x0;
            mVar20.e_ = mVar23.e_;
            local_2b8 = (referred_type *)sVar11;
            if ((uint)local_1c8 < 0xffffff01) {
              local_230 = (referred_type *)sVar11;
              local_270 = mVar23.e_;
              local_1f0 = (long)local_1f0 - mVar23.e_;
              local_2b8 = (referred_type *)local_1d0;
              mVar23.e_ = (referred_type *)0x0;
              prVar26 = (referred_type *)0x0;
              prVar28 = local_1e8;
              prVar18 = local_2b8;
              do {
                local_2b8 = prVar18;
                boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                          ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_208,
                           (size_type)local_210);
                local_2a8.data_.e_ = local_278;
                local_2a8.r1_.size_ = local_268._0_8_;
                local_2a8.r2_.start_ = (size_type)local_268._M_parent;
                pRVar24 = (R10_Decoder *)local_248;
                local_2a8.r1_.start_ = (size_type)prVar28;
                boost::numeric::ublas::
                vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                             *)pRVar24,
                            (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                             *)&local_2a8);
                boost::numeric::ublas::
                unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::unbounded_array
                          (&local_78,
                           (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar24
                          );
                find_nonZeros_pos_In_Row
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar24
                           ,(vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_78,0,7);
                prVar25 = (referred_type *)local_2a8.r1_.size_;
                sVar11 = local_2a8.r1_.start_;
                mVar22.e_ = local_2a8.data_.e_;
                local_2a8.data_.e_ = (matrix_type *)0x0;
                local_2a8.r1_.start_ = 0;
                local_2a8.r1_.size_ = 0;
                if (mVar23.e_ != (referred_type *)0x0) {
                  operator_delete(mVar23.e_,(long)prVar26 - (long)mVar23.e_);
                }
                if (local_2a8.data_.e_ != (matrix_type *)0x0) {
                  operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_)
                  ;
                }
                if (local_78.size_ != 0) {
                  operator_delete(local_78.data_,local_78.size_);
                }
                prVar18 = sVar11 - mVar22.e_;
                if ((prVar18 == local_1f0) &&
                   (((referred_type *)sVar11 == mVar22.e_ ||
                    (iVar21 = bcmp(mVar22.e_,local_270,(size_t)prVar18), iVar21 == 0)))) {
                  local_2a8.data_.e_ = local_1f8;
                  local_2a8.r1_.start_ = (size_type)local_220;
                  boost::numeric::ublas::
                  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                            ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                              *)&local_268,
                             (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)&local_2a8);
                  pAVar13 = local_1b8;
                  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                            (&local_1b0,(ulong)*(uint32_t *)((long)local_268._M_right + 0x50),
                             (ulong)local_1b8->L);
                  local_118 = &local_268;
                  local_110 = (referred_type **)local_1b0.start_;
                  puStack_108 = (pointer)local_1b0.size_;
                  boost::numeric::ublas::
                  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                            ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                              *)&local_100,
                             (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)&local_118);
                  local_198 = local_278;
                  local_190 = prVar28;
                  boost::numeric::ublas::
                  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                            (local_90,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                       *)&local_198);
                  Utility::matrix_row_XOR
                            ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_2a8,local_1c0,&local_100,
                             (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_90);
                  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                            (&local_e8,(ulong)*(uint32_t *)((long)local_268._M_right + 0x50),
                             (ulong)pAVar13->L);
                  local_1b0.start_ = (size_type)&local_268;
                  local_1b0.size_ = local_e8.start_;
                  pVStack_1a0 = (pointer)local_e8.size_;
                  boost::numeric::ublas::
                  vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                               *)&local_1b0,
                              (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_2a8);
                  if ((referred_type *)local_2a8.r1_.start_ != (referred_type *)0x0) {
                    operator_delete((void *)local_2a8.r1_.size_,local_2a8.r1_.start_);
                  }
                  if (local_88 != (pointer)0x0) {
                    operator_delete(local_80,(ulong)local_88);
                  }
                  local_228 = prVar25;
                  if ((pointer)local_100.data_.size_ != (pointer)0x0) {
                    operator_delete(local_100.data_.data_,local_100.data_.size_);
                  }
                  prVar25 = local_220;
                  local_2a8.data_.e_ = local_1f8;
                  local_2a8.r1_.start_ = (size_type)local_220;
                  boost::numeric::ublas::
                  matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                               *)&local_2a8,
                              (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_268);
                  p_Var12 = local_268._M_right;
                  Vector_Data_DEF::operator^
                            ((Vector_Data_DEF *)&local_2a8,
                             (pAVar13->symbol).
                             super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                             (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              ((long)local_268._M_right + 0x38))->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[(long)prVar25],
                             (Vector_Data_DEF *)
                             ((long)&(((((precompute_matrix *)((long)local_268._M_right + 0x160))->
                                       D_p).symbol.
                                       super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->s).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl + (long)local_2b8));
                  pVVar27 = (pAVar13->symbol).
                            super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                            (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)p_Var12 + 0x38))->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[(long)prVar25];
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                            (&pVVar27->s,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
                  pVVar27->d_len = (uint32_t)local_2a8.r2_.start_;
                  Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)&local_2a8);
                  prVar25 = local_228;
                  if (local_268._M_parent != (_Base_ptr)0x0) {
                    operator_delete(local_268._M_left,(ulong)local_268._M_parent);
                  }
                }
                prVar28 = (referred_type *)((long)&prVar28->size1_ + 1);
                prVar18 = (referred_type *)((long)local_2b8 + 0x20);
                mVar20.e_ = local_270;
                mVar23.e_ = mVar22.e_;
                prVar26 = prVar25;
                local_2b8 = local_230;
              } while (prVar28 < local_218);
            }
            if (mVar22.e_ != (referred_type *)0x0) {
              operator_delete(mVar22.e_,(long)prVar25 - (long)mVar22.e_);
            }
          }
          local_220 = (referred_type *)((long)&local_220->size1_ + 1);
        } while (local_220 < local_188.size1_);
      }
      local_200 = (referred_type *)((long)&local_200->size1_ + 1);
      uVar16 = (int)local_1e8 + 0xff;
    } while (local_200 != local_1d8);
  }
  if ((referred_type *)local_188.size1_ != (referred_type *)0x0) {
    iVar21 = (int)local_1e0;
    uVar16 = iVar21 * 0xff;
    local_200 = (referred_type *)(ulong)uVar16;
    local_210 = (pointer)(ulong)(uint)(iVar21 * 8);
    local_228 = (referred_type *)(ulong)(iVar21 * 8 + 8);
    local_1e8 = (referred_type *)CONCAT44(local_1e8._4_4_,uVar16 - 1);
    local_1d0 = CONCAT44(local_1d0._4_4_,uVar16 + 0xff);
    local_208 = (referred_type *)((long)local_268._M_right + 0x160);
    local_1c0 = (Utility *)((long)local_268._M_right + 0x140);
    local_1d8 = (referred_type *)((long)local_200 << 5);
    local_1e0 = (pointer)CONCAT44(local_1e0._4_4_,iVar21 * -0xff);
    prVar25 = (referred_type *)0x0;
    local_1c8 = local_200;
    do {
      uVar16 = *(uint32_t *)((long)local_268._M_right + 0x54) & 7;
      if (uVar16 == 0) {
        boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                  ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_210,
                   (size_type)local_228);
        local_2a8.data_.e_ = &local_188;
        local_2a8.r1_.size_ = local_268._0_8_;
        local_2a8.r2_.start_ = (size_type)local_268._M_parent;
        local_2a8.r1_.start_ = (size_type)prVar25;
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_248,
                    (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)&local_2a8);
      }
      else {
        boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                  ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_210,
                   (ulong)(uVar16 | (uint)local_210));
        local_2a8.data_.e_ = &local_188;
        local_2a8.r1_.size_ = local_268._0_8_;
        local_2a8.r2_.start_ = (size_type)local_268._M_parent;
        local_2a8.r1_.start_ = (size_type)prVar25;
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_248,
                    (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)&local_2a8);
      }
      local_218 = prVar25;
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      unbounded_array(&local_130,
                      (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)local_248);
      uVar16 = local_248._8_4_ - 1;
      sVar19 = 0;
      iVar21 = 0;
      do {
        puVar15 = boost::numeric::ublas::
                  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&local_130,sVar19);
        iVar21 = iVar21 + (uint)(*puVar15 == '\x01');
        sVar19 = sVar19 + 1;
      } while ((uint)sVar19 <= uVar16);
      if ((_Base_ptr)local_130.size_ != (_Base_ptr)0x0) {
        operator_delete(local_130.data_,local_130.size_);
      }
      if (iVar21 != 0) {
        pRVar24 = (R10_Decoder *)local_248;
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        unbounded_array(&local_a8,
                        (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar24);
        find_nonZeros_pos_In_Row
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar24,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_a8,0,local_248._8_4_ - 1);
        sVar11 = local_2a8.r1_.size_;
        mVar23.e_ = local_2a8.data_.e_;
        local_1f0 = (referred_type *)local_2a8.r1_.start_;
        local_2a8.data_.e_ = (matrix_type *)0x0;
        local_2a8.r1_.start_ = 0;
        local_2a8.r1_.size_ = 0;
        if (mVar20.e_ != (matrix_type *)0x0) {
          operator_delete(mVar20.e_,(long)local_2b8 - (long)mVar20.e_);
        }
        if (local_2a8.data_.e_ != (matrix_type *)0x0) {
          operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
        }
        if ((pointer)local_a8.size_ != (pointer)0x0) {
          operator_delete(local_a8.data_,local_a8.size_);
        }
        uVar17 = *(uint32_t *)((long)local_268._M_right + 0x54) & 7;
        uVar16 = (1 << (sbyte)uVar17) + (int)local_1e8;
        if (uVar17 == 0) {
          uVar16 = (uint)local_1d0;
        }
        mVar22.e_ = (referred_type *)0x0;
        local_278 = (referred_type *)0x0;
        mVar20.e_ = mVar23.e_;
        local_2b8 = (referred_type *)sVar11;
        if ((uint)local_1c8 < uVar16) {
          local_230 = (referred_type *)sVar11;
          local_270 = mVar23.e_;
          local_1f0 = (long)local_1f0 - mVar23.e_;
          iVar21 = uVar16 + (int)local_1e0;
          local_278 = (referred_type *)0x0;
          local_2b8 = (referred_type *)0x0;
          prVar25 = local_200;
          prVar18 = local_1d8;
          pRVar24 = (R10_Decoder *)local_268._M_right;
          mVar22.e_ = local_2b8;
          do {
            local_2b8 = mVar22.e_;
            uVar16 = pRVar24->A_u & 7;
            if (uVar16 == 0) {
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_210,
                         (size_type)local_228);
              local_2a8.data_.e_ = local_208;
              local_2a8.r1_.size_ = local_268._0_8_;
              local_2a8.r2_.start_ = (size_type)local_268._M_parent;
              local_2a8.r1_.start_ = (size_type)prVar25;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_248,
                          (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                           *)&local_2a8);
            }
            else {
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_210,
                         (ulong)(uVar16 | (uint)local_210));
              local_2a8.data_.e_ = local_208;
              local_2a8.r1_.size_ = local_268._0_8_;
              local_2a8.r2_.start_ = (size_type)local_268._M_parent;
              local_2a8.r1_.start_ = (size_type)prVar25;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_248,
                          (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                           *)&local_2a8);
            }
            if ((pRVar24->A_u & 7) == 0) {
              pRVar24 = (R10_Decoder *)local_248;
              boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>
              ::unbounded_array(&local_160,
                                (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                                pRVar24);
              find_nonZeros_pos_In_Row
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar24,
                         (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_160,0,7);
              prVar28 = (referred_type *)local_2a8.r1_.size_;
              prVar26 = (referred_type *)local_2a8.r1_.start_;
              mVar22.e_ = local_2a8.data_.e_;
              local_2a8.data_.e_ = (matrix_type *)0x0;
              local_2a8.r1_.start_ = 0;
              local_2a8.r1_.size_ = 0;
              if (local_2b8 != (referred_type *)0x0) {
                operator_delete(local_2b8,(long)local_278 - (long)local_2b8);
              }
              uVar2 = local_160.size_;
              puVar3 = local_160.data_;
              if (local_2a8.data_.e_ != (matrix_type *)0x0) {
                operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
                uVar2 = local_160.size_;
                puVar3 = local_160.data_;
              }
            }
            else {
              this_00 = (R10_Decoder *)local_248;
              boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>
              ::unbounded_array(&local_c0,
                                (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                                this_00);
              find_nonZeros_pos_In_Row
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,this_00,
                         (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_c0,0,(pRVar24->A_u & 7) - 1);
              prVar28 = (referred_type *)local_2a8.r1_.size_;
              prVar26 = (referred_type *)local_2a8.r1_.start_;
              mVar22.e_ = local_2a8.data_.e_;
              local_2a8.data_.e_ = (matrix_type *)0x0;
              local_2a8.r1_.start_ = 0;
              local_2a8.r1_.size_ = 0;
              if (local_2b8 != (referred_type *)0x0) {
                operator_delete(local_2b8,(long)local_278 - (long)local_2b8);
              }
              uVar2 = local_c0.size_;
              puVar3 = local_c0.data_;
              if (local_2a8.data_.e_ != (matrix_type *)0x0) {
                operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
                uVar2 = local_c0.size_;
                puVar3 = local_c0.data_;
              }
            }
            if (uVar2 != 0) {
              operator_delete(puVar3,uVar2);
            }
            pRVar24 = (R10_Decoder *)local_268._M_right;
            local_278 = prVar28;
            if (((long)prVar26 - mVar22.e_ == local_1f0) &&
               ((prVar26 == mVar22.e_ ||
                (iVar14 = bcmp(mVar22.e_,local_270,(size_t)((long)prVar26 - mVar22.e_)), iVar14 == 0
                )))) {
              local_2a8.data_.e_ = local_1f8;
              local_2a8.r1_.start_ = (size_type)local_218;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::
              vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                        ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_268,
                         (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_2a8);
              pAVar13 = local_1b8;
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        (&local_1b0,(ulong)*(uint32_t *)((long)pRVar24 + 0x50),(ulong)local_1b8->L);
              local_118 = &local_268;
              local_110 = (referred_type **)local_1b0.start_;
              puStack_108 = (pointer)local_1b0.size_;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::
              vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                        ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_148,
                         (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_118);
              local_198 = local_208;
              local_190 = prVar25;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::
              vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                        (local_d8,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                   *)&local_198);
              Utility::matrix_row_XOR
                        ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_2a8,local_1c0,&local_148,
                         (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_d8);
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        (&local_e8,(ulong)*(uint32_t *)((long)pRVar24 + 0x50),(ulong)pAVar13->L);
              local_1b0.start_ = (size_type)&local_268;
              local_1b0.size_ = local_e8.start_;
              pVStack_1a0 = (pointer)local_e8.size_;
              boost::numeric::ublas::
              vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
              ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_1b0,
                          (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&local_2a8);
              if ((referred_type *)local_2a8.r1_.start_ != (referred_type *)0x0) {
                operator_delete((void *)local_2a8.r1_.size_,local_2a8.r1_.start_);
              }
              local_220 = (referred_type *)CONCAT44(local_220._4_4_,iVar21);
              if (local_d0 != 0) {
                operator_delete(local_c8,local_d0);
              }
              if ((pointer)local_148.data_.size_ != (pointer)0x0) {
                operator_delete(local_148.data_.data_,local_148.data_.size_);
              }
              prVar26 = local_218;
              local_2a8.data_.e_ = local_1f8;
              local_2a8.r1_.start_ = (size_type)local_218;
              boost::numeric::ublas::
              matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
              ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_2a8,
                          (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&local_268);
              Vector_Data_DEF::operator^
                        ((Vector_Data_DEF *)&local_2a8,
                         (pAVar13->symbol).
                         super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((long)pRVar24 + 0x38))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start[(long)prVar26],
                         (Vector_Data_DEF *)
                         ((long)&prVar18->size1_ +
                         (long)(((precompute_matrix *)((long)pRVar24 + 0x160))->D_p).symbol.
                               super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                               ._M_impl.super__Vector_impl_data._M_start));
              pVVar27 = (pAVar13->symbol).
                        super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)pRVar24 + 0x38))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start[(long)prVar26];
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&pVVar27->s,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
              iVar21 = (int)local_220;
              pVVar27->d_len = (uint32_t)local_2a8.r2_.start_;
              Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)&local_2a8);
              if (local_268._M_parent != (_Base_ptr)0x0) {
                operator_delete(local_268._M_left,(ulong)local_268._M_parent);
              }
            }
            prVar25 = (referred_type *)((long)&prVar25->size1_ + 1);
            prVar18 = (referred_type *)&(prVar18->data_).data_;
            iVar21 = iVar21 + -1;
            mVar20.e_ = local_270;
            local_2b8 = local_230;
          } while (iVar21 != 0);
        }
        if (mVar22.e_ != (referred_type *)0x0) {
          operator_delete(mVar22.e_,(long)local_278 - (long)mVar22.e_);
        }
      }
      prVar25 = (referred_type *)((long)&local_218->size1_ + 1);
    } while (prVar25 < local_188.size1_);
  }
  pAVar13 = local_1b8;
  uVar7 = local_1b8->sym_len;
  uVar8 = local_1b8->X;
  uVar9 = local_1b8->S;
  uVar10 = local_1b8->H;
  uVar4 = local_1b8->L;
  uVar5 = local_1b8->LP;
  uVar6 = local_1b8->K;
  __return_storage_ptr__->HP = local_1b8->HP;
  __return_storage_ptr__->L = uVar4;
  __return_storage_ptr__->LP = uVar5;
  __return_storage_ptr__->K = uVar6;
  __return_storage_ptr__->sym_len = uVar7;
  __return_storage_ptr__->X = uVar8;
  __return_storage_ptr__->S = uVar9;
  __return_storage_ptr__->H = uVar10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->ESIs,&local_1b8->ESIs);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator=
            (&__return_storage_ptr__->symbol,&pAVar13->symbol);
  uVar7 = pAVar13->_K;
  uVar8 = pAVar13->_X;
  uVar9 = pAVar13->_S;
  uVar10 = pAVar13->_H;
  uVar4 = pAVar13->_L;
  uVar5 = pAVar13->_LP;
  uVar6 = pAVar13->_sym_len;
  __return_storage_ptr__->_HP = pAVar13->_HP;
  __return_storage_ptr__->_L = uVar4;
  __return_storage_ptr__->_LP = uVar5;
  __return_storage_ptr__->_sym_len = uVar6;
  __return_storage_ptr__->_K = uVar7;
  __return_storage_ptr__->_X = uVar8;
  __return_storage_ptr__->_S = uVar9;
  __return_storage_ptr__->_H = uVar10;
  if ((Inter_Symbol_Generator *)local_248._8_8_ != (Inter_Symbol_Generator *)0x0) {
    operator_delete((void *)local_248._16_8_,local_248._8_8_);
  }
  if (mVar20.e_ != (matrix_type *)0x0) {
    operator_delete(mVar20.e_,(long)local_2b8 - (long)mVar20.e_);
  }
  if (local_188.data_.size_ != 0) {
    operator_delete(local_188.data_.data_,local_188.data_.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_4(matrix<uint8_t> &A, class Array_Data_Symbol &D,  uint32_t &M)
{

	/*
	For each of the first i rows of A, for each group of 8 columns in the
   U_upper submatrix of this row, if the set of 8 column entries in
   U_upper are not all zero, then the row of the precomputation matrix
   U' that matches the pattern in the 8 columns is exclusive-ORed into
   the row, thus zeroing out those 8 columns in the row at the cost of
   exclusive-ORing one row of U' into the row.
	
	*/

	class Array_Data_Symbol result;

	uint32_t groups_num = std::ceil(A_u / 8.0);

	uint32_t nonZeros = 0;

	ublas::matrix<uint8_t> U_upper =  ublas::project(A, range(0, A_i), range(A_i, D.L));

	std::vector<uint32_t> nonZeros_pos;
	nonZeros_pos.clear();

	ublas::vector<uint8_t> group_col(8);



	// for (int i = 0; i < U_upper.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < U_upper.size2(); j++)
	// 	{
	// 		printf("%d ",  U_upper(i, j));  
	// 	}
	// 	printf("\n");
	// }

	//groups_num = 1;
	uint32_t _row = 0;
	for (int i = 0; i < groups_num - 1; i++)
	{


		_row = i * 255;
		for (int j = 0; j < U_upper.size1(); j++)
		{

			group_col = ublas::project(ublas::row(U_upper, j), range(8 * i, 8 * i + 8));

			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

			nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
		//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

			if (nonZeros == 0)
			{
				continue;
			}


		//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

			nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

			// for (int k = 0; k < nonZeros_pos.size(); k++)
			// {
			// 	std::cout << "  " << nonZeros_pos[k];
			// }
			// std::cout << std::endl;


		//	std::cout << "match_pos: " << std::endl;
			std::vector<uint32_t> match_pos;
			//	printf(" %d \n", _row);
			uint32_t orig_row = _row;
			while(_row < 255 * (i + 1))
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * i, 8 * i + 8));

//				match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * i, 8 * i + 8 - 1);
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);
				


				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				//std::cout << std::endl;

				if (match_pos == nonZeros_pos)
				{
			//		std::cout << "match_pos == nonZeros_pos" << std::endl;
					// for (int k = 0; k < nonZeros_pos.size(); k++)
					// {
					// 	std::cout << "  " << nonZeros_pos[k];
					// }
					// std::cout << std::endl;

					// for (int k = 0; k < match_pos.size(); k++)
					// {
					// 	printf(" %d ", match_pos[k]);
					// }
					// std::cout << std::endl;


					ublas::vector<uint8_t> for_xor = ublas::row(A, j);
					 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
					//exit(0);
					 D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				}
				// the _row can increase after matching.
				_row++;

			}
			_row = orig_row;


		//	std::cout << std::endl;
		}
		
	}

				


	// last group handle
	//std::cout << "last group handle: " << std::endl;


	_row = (groups_num - 1) * 255;
	for (int j = 0; j < U_upper.size1(); j++)
	{

		if (A_u % 8 == 0)
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + 8));
		}
		else
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8));
		}
		

		// for (int k = 0; k < group_col.size(); k++)
		// {
		// 	printf(" %d ", group_col(k));
		// }
		// std::cout << std::endl;
	



		nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
	//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

		if (nonZeros == 0)
		{
			continue;
		}

			

	//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

		nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

		// for (int k = 0; k < nonZeros_pos.size(); k++)
		// {
		// 	std::cout << " " << nonZeros_pos[k];
		// }
		// std::cout << std::endl;



	//	std::cout << "match_pos: " << std::endl;
		std::vector<uint32_t> match_pos;
		//	printf(" %d \n", _row);
		uint32_t orig_row = _row;


		uint32_t last_group_condition = 255 * (groups_num - 1) + (1 << A_u % 8) - 1;

		if (A_u % 8 == 0)
		{
			last_group_condition = 255 * (groups_num - 1) + 255;
		}

		uint32_t chosen_col = 0;

	//	std::cout << "last_group_condition: " << last_group_condition << std::endl;

		//while(_row < 255 * (groups_num - 1) + (1 << A_u % 8) - 1 )
		while(_row < last_group_condition)
		{





			if (A_u % 8 == 0)
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + 8));
			}
			else
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + A_u % 8));

			}


			//match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8 - 1);

			if (A_u % 8 == 0)
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);

			}
			else
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, A_u % 8 - 1);

			}


			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

				// for (int k = 0; k < precomput_param.U_p.size2(); k++)
				// {
				// 	printf(" %d ", precomput_param.U_p(_row,k));
					
				// }

				//std::cout << A_u % 8 - 1 << std::endl;


			// for (int k = 0; k < match_pos.size(); k++)
			// {
			// 	printf(" %d ", match_pos[k]);
			// }
			// std::cout << std::endl;




	//		std::cout << "_row: "<< _row << std::endl;

			if (match_pos == nonZeros_pos)
			{

				// std::cout << "match_pos == nonZeros_pos" << std::endl;


				// for (int k = 0; k < nonZeros_pos.size(); k++)
				// {
				// 	std::cout << "  " << nonZeros_pos[k];
				// }
				// std::cout << std::endl;

				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				// std::cout << std::endl;


				ublas::vector<uint8_t> for_xor = ublas::row(A, j);
				 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
				
				D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				

			}
			_row++;


		}
		_row = orig_row;


//		std::cout << std::endl;
	}

	// for (int i = 0; i < precomput_param.U_p.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < precomput_param.U_p.size2(); j++)
	// 	{
	// 		printf("%d ",  precomput_param.U_p(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	// for (int i = 0; i < A.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < A.size2(); j++)
	// 	{
	// 		printf("%d ",  A(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	result = D;


	return result;
}